

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_label_impl.h
# Opt level: O0

void __thiscall label::JSONLabel::JSONLabel(JSONLabel *this,string *label)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  string *label_local;
  JSONLabel *this_local;
  
  std::__cxx11::string::string((string *)this);
  this->type_ = 0;
  std::__cxx11::string::operator=((string *)this,(string *)label);
  iVar1 = std::__cxx11::string::compare((char *)label);
  if (iVar1 == 0) {
    this->type_ = 0;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)label);
    if (iVar1 == 0) {
      this->type_ = 1;
    }
    else {
      uVar2 = std::__cxx11::string::length();
      if (1 < uVar2) {
        std::__cxx11::string::length();
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)label);
        if (*pcVar3 == ':') {
          this->type_ = 2;
          return;
        }
      }
      this->type_ = 3;
    }
  }
  return;
}

Assistant:

JSONLabel::JSONLabel(const std::string& label) {
  label_ = label;

  // Set type to 0 in case of an object. An object is indicated by opening
  // and closing curly braces.
  if (label.compare("\\{\\}") == 0) {
    type_ = 0;
  }
  // Set type to 1 in case of an array. An array is indicated by opening
  // and closing brackets.
  else if (label.compare("[]") == 0) {
    type_ = 1;
  }
  // Set type to 2 in case of an key. A key is indicated by a colon after
  // the key itself.
  else if (label.length() >= 2 && label[label.length() - 1] == ':') {
    type_ = 2;
  }
  // Otherwise, set type to 3 in case of a value.
  else {
    type_ = 3;
  }
}